

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

bool __thiscall cmCTestSVN::LoadRepositories(cmCTestSVN *this)

{
  bool bVar1;
  vector<const_char_*,_std::allocator<const_char_*>_> svn_status;
  OutputLogger err;
  ExternalParser out;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_188;
  LineParser local_168;
  ExternalParser local_128;
  
  bVar1 = true;
  if ((this->Repositories).
      super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl._M_node.
      super__List_node_base._M_next == (_List_node_base *)&this->Repositories) {
    std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::emplace_back<>
              (&this->Repositories);
    this->RootInfo =
         (SVNInfo *)
         ((this->Repositories).
          super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
          _M_node.super__List_node_base._M_prev + 1);
    local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x5fffa1;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_188,(char **)&local_128);
    ExternalParser::ExternalParser(&local_128,this,"external-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)&local_168,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "external-err> ");
    bVar1 = RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_188,
                          (OutputParser *)&local_128,&local_168.super_OutputParser);
    cmProcessTools::LineParser::~LineParser(&local_168);
    ExternalParser::~ExternalParser(&local_128);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_188);
  }
  return bVar1;
}

Assistant:

bool cmCTestSVN::LoadRepositories()
{
  if (!this->Repositories.empty()) {
    return true;
  }

  // Info for root repository
  this->Repositories.emplace_back();
  this->RootInfo = &(this->Repositories.back());

  // Run "svn status" to get the list of external repositories
  std::vector<const char*> svn_status;
  svn_status.push_back("status");
  ExternalParser out(this, "external-out> ");
  OutputLogger err(this->Log, "external-err> ");
  return this->RunSVNCommand(svn_status, &out, &err);
}